

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_wrap_in_array(qpdf_data qpdf,qpdf_oh oh)

{
  uint uVar1;
  anon_class_8_1_8990bbdf local_68;
  function<unsigned_int_(QPDFObjectHandle_&)> local_60;
  anon_class_8_1_8990bbdf local_40;
  function<unsigned_int_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_40.qpdf = qpdf;
  local_14 = oh;
  p_Stack_10 = qpdf;
  std::function<unsigned_int()>::function<qpdf_oh_wrap_in_array::__0,void>
            ((function<unsigned_int()> *)&local_38,&local_40);
  local_68.qpdf = p_Stack_10;
  std::function<unsigned_int(QPDFObjectHandle&)>::function<qpdf_oh_wrap_in_array::__1,void>
            ((function<unsigned_int(QPDFObjectHandle&)> *)&local_60,&local_68);
  uVar1 = do_with_oh<unsigned_int>(qpdf,oh,&local_38,&local_60);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<unsigned_int_()>::~function(&local_38);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_wrap_in_array(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<qpdf_oh>(
        qpdf,
        oh,
        [qpdf]() { return qpdf_oh_new_array(qpdf); },
        [qpdf](QPDFObjectHandle& qoh) {
            if (qoh.isArray()) {
                QTC::TC("qpdf", "qpdf-c array to wrap_in_array");
                return new_object(qpdf, qoh);
            } else {
                QTC::TC("qpdf", "qpdf-c non-array to wrap_in_array");
                return new_object(
                    qpdf, QPDFObjectHandle::newArray(std::vector<QPDFObjectHandle>{qoh}));
            }
        });
}